

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void rekey_test(void)

{
  fdb_encryption_key new_key;
  fdb_kvs_handle *pfVar1;
  void *ptr;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  size_t valuelen_00;
  ulong uVar5;
  uint uVar6;
  char *__format;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  void *value;
  size_t valuelen;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char temp [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_kvs_handle *local_4a0;
  fdb_file_handle *local_498;
  void *local_490;
  size_t local_488 [3];
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined4 local_460;
  fdb_kvs_config local_458;
  timeval local_440;
  fdb_config local_430;
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  gettimeofday(&local_440,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_430.wal_threshold = 0x400;
  local_430.flags = 1;
  local_430.purging_interval = 0;
  local_430.compaction_threshold = '\0';
  local_430.encryption_key.algorithm = -1;
  builtin_memcpy(local_430.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&local_498,"./dummy1",&local_430);
  fdb_kvs_open_default(local_498,&local_4a0,&local_458);
  fVar2 = fdb_set_log_callback(local_4a0,logCallbackFunc,"api_wrapper_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119a21;
  fVar2 = fdb_set_kv(local_4a0,(void *)0x0,0,(void *)0x0,0);
  if (fVar2 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
  uVar5 = 0;
  do {
    sprintf(local_238,"key%d",uVar5);
    sprintf(local_138,"body%d",uVar5);
    pfVar1 = local_4a0;
    sVar4 = strlen(local_238);
    valuelen_00 = strlen(local_138);
    fVar2 = fdb_set_kv(pfVar1,local_238,sVar4,local_138,valuelen_00);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      rekey_test();
      goto LAB_00119a0a;
    }
    uVar6 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar6;
  } while (uVar6 != 10);
  local_488[1] = 0x726162ffffffff;
  local_488[2] = 0xbdbdbdbdbdbdbdbd;
  uStack_470 = 0xbdbdbdbd;
  uStack_46c = 0xbdbdbdbd;
  uStack_468 = 0xbdbdbdbd;
  uStack_464 = 0xbdbdbdbd;
  local_460 = 0xbdbdbdbd;
  new_key.bytes[4] = 0xbd;
  new_key.bytes[5] = 0xbd;
  new_key.bytes[6] = 0xbd;
  new_key.bytes[7] = 0xbd;
  new_key.bytes[8] = 0xbd;
  new_key.bytes[9] = 0xbd;
  new_key.bytes[10] = 0xbd;
  new_key.bytes[0xb] = 0xbd;
  new_key.algorithm = -1;
  new_key.bytes[0] = 'b';
  new_key.bytes[1] = 'a';
  new_key.bytes[2] = 'r';
  new_key.bytes[3] = '\0';
  new_key.bytes[0xc] = 0xbd;
  new_key.bytes[0xd] = 0xbd;
  new_key.bytes[0xe] = 0xbd;
  new_key.bytes[0xf] = 0xbd;
  new_key.bytes[0x10] = 0xbd;
  new_key.bytes[0x11] = 0xbd;
  new_key.bytes[0x12] = 0xbd;
  new_key.bytes[0x13] = 0xbd;
  new_key.bytes[0x14] = 0xbd;
  new_key.bytes[0x15] = 0xbd;
  new_key.bytes[0x16] = 0xbd;
  new_key.bytes[0x17] = 0xbd;
  new_key.bytes[0x18] = 0xbd;
  new_key.bytes[0x19] = 0xbd;
  new_key.bytes[0x1a] = 0xbd;
  new_key.bytes[0x1b] = 0xbd;
  new_key.bytes[0x1c] = 0xbd;
  new_key.bytes[0x1d] = 0xbd;
  new_key.bytes[0x1e] = 0xbd;
  new_key.bytes[0x1f] = 0xbd;
  fVar2 = fdb_rekey(local_498,new_key);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
  fdb_kvs_close(local_4a0);
  fdb_close(local_498);
  local_430.encryption_key.algorithm = -1;
  builtin_memcpy(local_430.encryption_key.bytes,"bar",4);
  local_430.encryption_key.bytes[4] = 0xbd;
  local_430.encryption_key.bytes[5] = 0xbd;
  local_430.encryption_key.bytes[6] = 0xbd;
  local_430.encryption_key.bytes[7] = 0xbd;
  local_430.encryption_key.bytes[8] = 0xbd;
  local_430.encryption_key.bytes[9] = 0xbd;
  local_430.encryption_key.bytes[10] = 0xbd;
  local_430.encryption_key.bytes[0xb] = 0xbd;
  local_430.encryption_key.bytes[0xc] = 0xbd;
  local_430.encryption_key.bytes[0xd] = 0xbd;
  local_430.encryption_key.bytes[0xe] = 0xbd;
  local_430.encryption_key.bytes[0xf] = 0xbd;
  local_430.encryption_key.bytes[0x10] = 0xbd;
  local_430.encryption_key.bytes[0x11] = 0xbd;
  local_430.encryption_key.bytes[0x12] = 0xbd;
  local_430.encryption_key.bytes[0x13] = 0xbd;
  local_430.encryption_key.bytes[0x14] = 0xbd;
  local_430.encryption_key.bytes[0x15] = 0xbd;
  local_430.encryption_key.bytes[0x16] = 0xbd;
  local_430.encryption_key.bytes[0x17] = 0xbd;
  local_430.encryption_key.bytes[0x18] = 0xbd;
  local_430.encryption_key.bytes[0x19] = 0xbd;
  local_430.encryption_key.bytes[0x1a] = 0xbd;
  local_430.encryption_key.bytes[0x1b] = 0xbd;
  local_430.encryption_key.bytes[0x1c] = 0xbd;
  local_430.encryption_key.bytes[0x1d] = 0xbd;
  local_430.encryption_key.bytes[0x1e] = 0xbd;
  local_430.encryption_key.bytes[0x1f] = 0xbd;
  fVar2 = fdb_open(&local_498,"./dummy1",&local_430);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
  fVar2 = fdb_kvs_open_default(local_498,&local_4a0,&local_458);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_log_callback(local_4a0,logCallbackFunc,"api_wrapper_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
    uVar5 = 0;
    while( true ) {
      sprintf(local_238,"key%d",uVar5);
      pfVar1 = local_4a0;
      sVar4 = strlen(local_238);
      fVar2 = fdb_get_kv(pfVar1,local_238,sVar4,&local_490,local_488);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      sprintf(local_338,"body%d",uVar5);
      ptr = local_490;
      iVar3 = bcmp(local_490,local_338,local_488[0]);
      if (iVar3 != 0) goto LAB_00119a0a;
      fdb_free_block(ptr);
      uVar6 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar6;
      if (uVar6 == 10) {
        fdb_kvs_close(local_4a0);
        fdb_close(local_498);
        fdb_shutdown();
        memleak_end();
        __format = "%s PASSED\n";
        if (rekey_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"encryption rekey test");
        return;
      }
    }
    goto LAB_00119a1a;
  }
  goto LAB_00119a3b;
LAB_00119a0a:
  rekey_test();
LAB_00119a1a:
  rekey_test();
LAB_00119a21:
  rekey_test();
LAB_00119a28:
  rekey_test();
LAB_00119a2d:
  rekey_test();
LAB_00119a34:
  rekey_test();
LAB_00119a3b:
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
}

Assistant:

void rekey_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    size_t valuelen;
    void *value;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;

    char keybuf[256], bodybuf[256], temp[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    fconfig.encryption_key.algorithm = -1; // Bogus encryption
    memset(fconfig.encryption_key.bytes, 0x42, sizeof(fconfig.encryption_key.bytes));

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "api_wrapper_test");
    TEST_STATUS(status);

    // error check
    status = fdb_set_kv(db, NULL, 0, NULL, 0);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // insert key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }

    // change the encryption key:
    fdb_encryption_key new_key;
    new_key.algorithm = -1; // Bogus encryption
    memset(new_key.bytes, 0xBD, sizeof(new_key.bytes));
    strcpy((char*)new_key.bytes, "bar");

    status = fdb_rekey(dbfile, new_key);
    TEST_STATUS(status);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen db
    fconfig.encryption_key = new_key;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_STATUS(status);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "api_wrapper_test");
    TEST_STATUS(status);

    // retrieve key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);

        // updated documents
        TEST_STATUS(status);
        sprintf(temp, "body%d", i);
        TEST_CMP(value, temp, valuelen);
        fdb_free_block(value);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("encryption rekey test");
}